

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

uchar * sqlite3_serialize(sqlite3 *db,char *zSchema,sqlite3_int64 *piSize,uint mFlags)

{
  long lVar1;
  Btree *p_00;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  MemFile *pMVar6;
  char *pcVar7;
  sqlite3_int64 sVar8;
  sqlite3_stmt *__s;
  void *__src;
  uint in_ECX;
  sqlite3_int64 *in_RDX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  uchar *pTo;
  int pgno;
  Pager *pPager;
  int nPage;
  MemStore *pStore;
  int rc;
  char *zSql;
  uchar *pOut;
  int szPage;
  sqlite3_int64 sz;
  Btree *pBt;
  int iDb;
  MemFile *p;
  DbPage *pPage;
  sqlite3_stmt *pStmt;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  sqlite3_stmt *in_stack_ffffffffffffff40;
  sqlite3_stmt *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  sqlite3 *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int iVar9;
  sqlite3_stmt *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  char *in_stack_ffffffffffffff78;
  MemStore *pMVar10;
  undefined4 in_stack_ffffffffffffff80;
  uchar *local_70;
  sqlite3_int64 local_60;
  long local_30;
  uchar *local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = in_RSI;
  if (in_RSI == 0) {
    local_30 = **(long **)(in_RDI + 0x20);
  }
  pMVar6 = memdbFromDbSchema(in_stack_ffffffffffffff58,
                             (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  iVar2 = sqlite3FindDbName((sqlite3 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                            ,(char *)in_stack_ffffffffffffff48);
  if (in_RDX != (sqlite3_int64 *)0x0) {
    *in_RDX = -1;
  }
  if (iVar2 < 0) {
    local_20 = (uchar *)0x0;
  }
  else if (pMVar6 == (MemFile *)0x0) {
    p_00 = *(Btree **)(*(long *)(in_RDI + 0x20) + (long)iVar2 * 0x20 + 8);
    if (p_00 == (Btree *)0x0) {
      local_20 = (uchar *)0x0;
    }
    else {
      iVar2 = sqlite3BtreeGetPageSize(p_00);
      pcVar7 = sqlite3_mprintf("PRAGMA \"%w\".page_count",local_30);
      if (pcVar7 == (char *)0x0) {
        iVar3 = 7;
      }
      else {
        iVar3 = sqlite3_prepare_v2((sqlite3 *)
                                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                   (char *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                                   (sqlite3_stmt **)in_stack_ffffffffffffff48,
                                   (char **)in_stack_ffffffffffffff40);
      }
      iVar4 = iVar3;
      sqlite3_free((void *)0x13a0cf);
      if (iVar4 == 0) {
        iVar4 = sqlite3_step(in_stack_ffffffffffffff68);
        if (iVar4 == 100) {
          sVar8 = sqlite3_column_int64(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
          local_60 = sVar8 * iVar2;
          if (local_60 == 0) {
            sqlite3_reset((sqlite3_stmt *)CONCAT44(iVar3,in_stack_ffffffffffffff50));
            sqlite3_exec((sqlite3 *)CONCAT44(iVar4,in_stack_ffffffffffffff80),
                         in_stack_ffffffffffffff78,
                         (sqlite3_callback)
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         in_stack_ffffffffffffff68,
                         (char **)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
            iVar4 = sqlite3_step(in_stack_ffffffffffffff68);
            if (iVar4 == 100) {
              sVar8 = sqlite3_column_int64(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
              local_60 = sVar8 * iVar2;
            }
          }
          if (in_RDX != (sqlite3_int64 *)0x0) {
            *in_RDX = local_60;
          }
          if ((in_ECX & 1) == 0) {
            local_70 = (uchar *)sqlite3_malloc64(CONCAT44(in_stack_ffffffffffffff3c,
                                                          in_stack_ffffffffffffff38));
            if (local_70 != (uchar *)0x0) {
              iVar4 = sqlite3_column_int(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
              sqlite3BtreePager(p_00);
              for (iVar9 = 1; iVar9 <= iVar4; iVar9 = iVar9 + 1) {
                __s = (sqlite3_stmt *)(local_70 + (long)iVar2 * (long)(iVar9 + -1));
                iVar5 = sqlite3PagerGet((Pager *)CONCAT44(iVar3,in_stack_ffffffffffffff50),
                                        (Pgno)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                                        (DbPage **)in_stack_ffffffffffffff40,
                                        in_stack_ffffffffffffff3c);
                if (iVar5 == 0) {
                  __src = sqlite3PagerGetData((DbPage *)0x0);
                  memcpy(__s,__src,(long)iVar2);
                  in_stack_ffffffffffffff48 = __s;
                }
                else {
                  memset(__s,0,(long)iVar2);
                }
                sqlite3PagerUnref((DbPage *)0x13a2c0);
              }
            }
          }
          else {
            local_70 = (uchar *)0x0;
          }
        }
        else {
          local_70 = (uchar *)0x0;
        }
        sqlite3_finalize(in_stack_ffffffffffffff48);
        local_20 = local_70;
      }
      else {
        local_20 = (uchar *)0x0;
      }
    }
  }
  else {
    pMVar10 = pMVar6->pStore;
    if (in_RDX != (sqlite3_int64 *)0x0) {
      *in_RDX = pMVar10->sz;
    }
    if ((in_ECX & 1) == 0) {
      local_70 = (uchar *)sqlite3_malloc64(CONCAT44(in_stack_ffffffffffffff3c,
                                                    in_stack_ffffffffffffff38));
      if (local_70 != (uchar *)0x0) {
        memcpy(local_70,pMVar10->aData,pMVar10->sz);
      }
    }
    else {
      local_70 = pMVar10->aData;
    }
    local_20 = local_70;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_20;
}

Assistant:

SQLITE_API unsigned char *sqlite3_serialize(
  sqlite3 *db,              /* The database connection */
  const char *zSchema,      /* Which database within the connection */
  sqlite3_int64 *piSize,    /* Write size here, if not NULL */
  unsigned int mFlags       /* Maybe SQLITE_SERIALIZE_NOCOPY */
){
  MemFile *p;
  int iDb;
  Btree *pBt;
  sqlite3_int64 sz;
  int szPage = 0;
  sqlite3_stmt *pStmt = 0;
  unsigned char *pOut;
  char *zSql;
  int rc;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif

  if( zSchema==0 ) zSchema = db->aDb[0].zDbSName;
  p = memdbFromDbSchema(db, zSchema);
  iDb = sqlite3FindDbName(db, zSchema);
  if( piSize ) *piSize = -1;
  if( iDb<0 ) return 0;
  if( p ){
    MemStore *pStore = p->pStore;
    assert( pStore->pMutex==0 );
    if( piSize ) *piSize = pStore->sz;
    if( mFlags & SQLITE_SERIALIZE_NOCOPY ){
      pOut = pStore->aData;
    }else{
      pOut = sqlite3_malloc64( pStore->sz );
      if( pOut ) memcpy(pOut, pStore->aData, pStore->sz);
    }
    return pOut;
  }
  pBt = db->aDb[iDb].pBt;
  if( pBt==0 ) return 0;
  szPage = sqlite3BtreeGetPageSize(pBt);
  zSql = sqlite3_mprintf("PRAGMA \"%w\".page_count", zSchema);
  rc = zSql ? sqlite3_prepare_v2(db, zSql, -1, &pStmt, 0) : SQLITE_NOMEM;
  sqlite3_free(zSql);
  if( rc ) return 0;
  rc = sqlite3_step(pStmt);
  if( rc!=SQLITE_ROW ){
    pOut = 0;
  }else{
    sz = sqlite3_column_int64(pStmt, 0)*szPage;
    if( sz==0 ){
      sqlite3_reset(pStmt);
      sqlite3_exec(db, "BEGIN IMMEDIATE; COMMIT;", 0, 0, 0);
      rc = sqlite3_step(pStmt);
      if( rc==SQLITE_ROW ){
        sz = sqlite3_column_int64(pStmt, 0)*szPage;
      }
    }
    if( piSize ) *piSize = sz;
    if( mFlags & SQLITE_SERIALIZE_NOCOPY ){
      pOut = 0;
    }else{
      pOut = sqlite3_malloc64( sz );
      if( pOut ){
        int nPage = sqlite3_column_int(pStmt, 0);
        Pager *pPager = sqlite3BtreePager(pBt);
        int pgno;
        for(pgno=1; pgno<=nPage; pgno++){
          DbPage *pPage = 0;
          unsigned char *pTo = pOut + szPage*(sqlite3_int64)(pgno-1);
          rc = sqlite3PagerGet(pPager, pgno, (DbPage**)&pPage, 0);
          if( rc==SQLITE_OK ){
            memcpy(pTo, sqlite3PagerGetData(pPage), szPage);
          }else{
            memset(pTo, 0, szPage);
          }
          sqlite3PagerUnref(pPage);
        }
      }
    }
  }
  sqlite3_finalize(pStmt);
  return pOut;
}